

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiID id;
  uint flags;
  char *str;
  ImS64 scroll;
  ImRect bb;
  long local_40;
  ImRect local_38;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_38 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    flags = (this->ScrollbarY ^ 1) << 7 | 0x140;
  }
  else {
    flags = (this->ScrollbarX ^ 1) * 0x80 + (uint)((this->Flags & 0x401U) == 1) * 0x20 + 0x100;
  }
  if ((uint)axis < 2) {
    fVar1 = (&(this->WindowPadding).x)[(uint)axis];
    local_40 = (long)(&(this->Scroll).x)[(uint)axis];
    ScrollbarEx(&local_38,id,axis,&local_40,
                (long)((&(this->InnerRect).Max.x)[(uint)axis] -
                      (&(this->InnerRect).Min.x)[(uint)axis]),
                (long)(fVar1 + fVar1 + (&(this->ContentSize).x)[(uint)axis]),flags);
    (&(this->Scroll).x)[(uint)axis] = (float)local_40;
    return;
  }
  __assert_fail("idx <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x105,"float &ImVec2::operator[](size_t)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ImS64 scroll = (ImS64)window->Scroll[axis];
    ScrollbarEx(bb, id, axis, &scroll, (ImS64)size_avail, (ImS64)size_contents, rounding_corners);
    window->Scroll[axis] = (float)scroll;
}